

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_sofa_c.c
# Opt level: O0

void t_a2tf(int *status)

{
  char s;
  int ihmsf [4];
  int *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  int in_stack_fffffffffffffff0;
  int in_stack_fffffffffffffff4;
  
  iauA2tf(in_stack_fffffffffffffff4,(double)in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
          in_stack_ffffffffffffffd8);
  viv(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,
      in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  viv(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,
      in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  viv(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,
      in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  viv(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,
      in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  viv(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,
      in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

static void t_a2tf(int *status)
/*
**  - - - - - - -
**   t _ a 2 t f
**  - - - - - - -
**
**  Test iauA2tf function.
**
**  Returned:
**     status    int         FALSE = success, TRUE = fail
**
**  Called:  iauA2tf, viv
**
**  This revision:  2013 August 7
*/
{
   int ihmsf[4];
   char s;


   iauA2tf(4, -3.01234, &s, ihmsf);

   viv((int)s, '-', "iauA2tf", "s", status);

   viv(ihmsf[0],   11, "iauA2tf", "0", status);
   viv(ihmsf[1],   30, "iauA2tf", "1", status);
   viv(ihmsf[2],   22, "iauA2tf", "2", status);
   viv(ihmsf[3], 6484, "iauA2tf", "3", status);

}